

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_vprintf(mg_connection *nc,char *fmt,__va_list_tag *ap)

{
  char *__ptr;
  int len;
  char *buf;
  char mem [100];
  char *local_90;
  char local_88 [104];
  
  local_90 = local_88;
  len = mg_avprintf(&local_90,100,fmt,ap);
  __ptr = local_90;
  if (0 < len) {
    mg_send(nc,local_90,len);
  }
  if (__ptr != (char *)0x0 && __ptr != local_88) {
    free(__ptr);
  }
  return len;
}

Assistant:

int mg_vprintf(struct mg_connection *nc, const char *fmt, va_list ap) {
    char mem[MG_VPRINTF_BUFFER_SIZE], *buf = mem;
    int len;

    if ((len = mg_avprintf(&buf, sizeof(mem), fmt, ap)) > 0) {
        mg_send(nc, buf, len);
    }
    if (buf != mem && buf != NULL) {
        MG_FREE(buf); /* LCOV_EXCL_LINE */
    }               /* LCOV_EXCL_LINE */

    return len;
}